

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall Buffer_add_Test::Buffer_add_Test(Buffer_add_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00179ab8;
  return;
}

Assistant:

TEST(Buffer, add) {
    auto buf = bfy_buffer_init();

    char constexpr ch = 'y';
    EXPECT_EQ(0, bfy_buffer_add_ch(&buf, ch));
    EXPECT_EQ(1, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(1, buffer_count_pages(&buf));

    bfy_buffer_destruct(&buf);
}